

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::ReflectionSchema::IsSplit(ReflectionSchema *this,FieldDescriptor *field)

{
  uint32_t *puVar1;
  char *pcVar2;
  int in_EDX;
  bool local_19;
  FieldDescriptor *field_local;
  ReflectionSchema *this_local;
  
  local_19 = false;
  if (this->split_offset_ != -1) {
    puVar1 = this->offsets_;
    pcVar2 = FieldDescriptor::index(field,(char *)field,in_EDX);
    local_19 = (puVar1[(int)pcVar2] & 0x80000000) != 0;
  }
  return local_19;
}

Assistant:

bool IsSplit(const FieldDescriptor* field) const {
    return split_offset_ != -1 &&
           (offsets_[field->index()] & kSplitFieldOffsetMask) != 0;
  }